

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O3

int bindkey(KEYMAP **mapp,char *fname,KCHAR *keys,int kcount)

{
  short sVar1;
  int iVar2;
  code *funct;
  PF p_Var3;
  KEYMAP *pref_map;
  KCHAR *pKVar4;
  int iVar5;
  keymap_s *local_38;
  KEYMAP *curmap;
  
  local_38 = (keymap_s *)mapp;
  if (fname == (char *)0x0) {
    funct = rescan;
  }
  else {
    funct = name_function(fname);
    if (funct == (PF)0x0) {
      pref_map = name_map(fname);
      if (pref_map == (KEYMAP *)0x0) {
        dobeep();
        ewprintf("[No match: %s]",fname);
        return 0;
      }
      funct = (PF)0x0;
      goto LAB_0010dde9;
    }
  }
  pref_map = (KEYMAP *)0x0;
LAB_0010dde9:
  pKVar4 = key.k_chars;
  iVar5 = (int)keys + -1;
  if (iVar5 != 0) {
    do {
      sVar1 = *pKVar4;
      p_Var3 = doscan(local_38,(int)sVar1,&local_38);
      if (p_Var3 != (PF)0x0) {
        iVar2 = remap(local_38,(int)sVar1,(PF)0x0,(KEYMAP *)0x0);
        if (iVar2 != 1) {
          return 0;
        }
        local_38 = ele->k_prefmap;
      }
      pKVar4 = pKVar4 + 1;
      iVar5 = iVar5 + -1;
      mapp = (KEYMAP **)local_38;
    } while (iVar5 != 0);
  }
  sVar1 = *pKVar4;
  doscan((KEYMAP *)mapp,(int)sVar1,(KEYMAP **)0x0);
  iVar5 = remap(local_38,(int)sVar1,funct,pref_map);
  return iVar5;
}

Assistant:

static int
bindkey(KEYMAP **mapp, const char *fname, KCHAR *keys, int kcount)
{
	KEYMAP	*curmap = *mapp;
	KEYMAP	*pref_map = NULL;
	PF	 funct;
	int	 c;

	if (fname == NULL)
		funct = rescan;
	else if (((funct = name_function(fname)) == NULL) ?
	    (pref_map = name_map(fname)) == NULL : funct == NULL) {
		dobeep();
		ewprintf("[No match: %s]", fname);
		return (FALSE);
	}
	while (--kcount) {
		if (doscan(curmap, c = *keys++, &curmap) != NULL) {
			if (remap(curmap, c, NULL, NULL) != TRUE)
				return (FALSE);
			/*
			 * XXX - Bizzarreness. remap creates an empty KEYMAP
			 *       that the last key is supposed to point to.
			 */
			curmap = ele->k_prefmap;
		}
	}
	(void)doscan(curmap, c = *keys, NULL);
	return (remap(curmap, c, funct, pref_map));
}